

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inverse_fourier_transform.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_22841::InverseFastFourierTransformWrapper::~InverseFastFourierTransformWrapper
          (InverseFastFourierTransformWrapper *this)

{
  pointer pdVar1;
  
  (this->super_FourierTransformInterface)._vptr_FourierTransformInterface =
       (_func_int **)&PTR__InverseFastFourierTransformWrapper_00119ba8;
  (this->inverse_fast_fourier_tranform_)._vptr_InverseFastFourierTransform =
       (_func_int **)&PTR__InverseFastFourierTransform_00119c68;
  (this->inverse_fast_fourier_tranform_).fast_fourier_transform_._vptr_FastFourierTransform =
       (_func_int **)&PTR__FastFourierTransform_00119748;
  pdVar1 = (this->inverse_fast_fourier_tranform_).fast_fourier_transform_.sine_table_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

~InverseFastFourierTransformWrapper() override {
  }